

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O0

base_learner * lrq_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  bool bVar3;
  pointer pLVar4;
  string *psVar5;
  reference this;
  ulong uVar6;
  reference pbVar7;
  undefined8 uVar8;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  uint *puVar12;
  base_learner *base;
  learner<LRQstate,_example> *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<LRQstate,_example> *l;
  uint k;
  stringstream __msg;
  string *i_1;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t i;
  uint32_t maxk;
  option_group_definition new_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lrq_names;
  free_ptr<LRQstate> lrq;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff908;
  vw *in_stack_fffffffffffff910;
  string *in_stack_fffffffffffff918;
  single_learner *in_stack_fffffffffffff920;
  string *in_stack_fffffffffffff928;
  learner<LRQstate,_example> *in_stack_fffffffffffff930;
  int plineNumber;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff938;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff940;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff958;
  option_group_definition *in_stack_fffffffffffff960;
  string *arg;
  uint local_608;
  undefined1 local_601;
  stringstream local_5e0 [16];
  stringstream local_5d0 [160];
  learner<char,_char> *in_stack_fffffffffffffad0;
  _Self local_450;
  _Self local_448;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  string local_428 [32];
  string *local_408;
  uint local_3fc [2];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [32];
  typed_option<bool> local_380 [2];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0 [2];
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  learner<LRQstate,_example> local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<LRQstate>();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x37d371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Low Rank Quadratics",&local_99);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff910,
             (string *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"lrq",&local_211);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffff918,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff910);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_1f0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"use low rank quadratic features",&local_239);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffff910,(string *)in_stack_fffffffffffff908);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"lrqdropout",&local_3a1);
  std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
            ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37d50b);
  VW::config::make_option<bool>(in_stack_fffffffffffff918,(bool *)in_stack_fffffffffffff910);
  VW::config::typed_option<bool>::keep(local_380,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3c8,"use dropout training for low rank quadratic features",&local_3c9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff910,(string *)in_stack_fffffffffffff908);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff910,
             (typed_option<bool> *)in_stack_fffffffffffff908);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff960,(typed_option<bool> *)in_stack_fffffffffffff958);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff910);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff910);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff910);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff910);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  (**(code **)*local_10)(local_10,local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"lrq",&local_3f1);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_3f0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  pvVar1 = local_18;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    local_3fc[0] = 0;
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37d9c8);
    pLVar4->all = pvVar1;
    local_408 = (string *)0x0;
    while (arg = local_408,
          psVar5 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_40), arg < psVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_40,(size_type)local_408);
      spoof_hex_encoded_namespaces(arg);
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_40,(size_type)local_408);
      std::__cxx11::string::operator=((string *)this,local_428);
      std::__cxx11::string::~string(local_428);
      local_408 = (string *)&local_408->field_0x1;
    }
    std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
              ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37da82);
    local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff908);
    local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff908);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff930,in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    uVar6 = local_18->random_seed | 0x845fed;
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37dafc);
    pLVar4->seed = uVar6;
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37db15);
    pLVar4->initial_seed = uVar6;
    if ((local_18->quiet & 1U) == 0) {
      std::operator<<(&(local_18->trace_message).super_ostream,
                      "creating low rank quadratic features for pairs: ");
      pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                         ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37db5c);
      if ((pLVar4->dropout & 1U) != 0) {
        std::operator<<(&(local_18->trace_message).super_ostream,"(using dropout) ");
      }
    }
    pLVar4 = std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37db93);
    local_440 = &pLVar4->lrpairs;
    local_448._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff908);
    local_450._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff908);
    while (bVar3 = std::operator!=(&local_448,&local_450), bVar3) {
      pbVar7 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x37dbf6);
      plineNumber = (int)((ulong)in_stack_fffffffffffff930 >> 0x20);
      if ((local_18->quiet & 1U) == 0) {
        uVar6 = std::__cxx11::string::length();
        if (uVar6 < 3) {
LAB_0037dc47:
          std::__cxx11::stringstream::stringstream(local_5e0);
          std::operator<<((ostream *)(local_5e0 + 0x10),
                          "error, low-rank quadratic features must involve two sets and a rank.");
          local_601 = 1;
          uVar8 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    ((vw_exception *)in_stack_fffffffffffff940._M_current,
                     (char *)in_stack_fffffffffffff938._M_current,plineNumber,
                     in_stack_fffffffffffff928);
          local_601 = 0;
          __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        std::__cxx11::string::c_str();
        bVar3 = valid_int((char *)in_stack_fffffffffffff910);
        if (!bVar3) goto LAB_0037dc47;
        poVar9 = std::operator<<(&(local_18->trace_message).super_ostream,(string *)pbVar7);
        std::operator<<(poVar9," ");
      }
      lVar10 = std::__cxx11::string::c_str();
      local_608 = atoi((char *)(lVar10 + 2));
      in_stack_fffffffffffff930 = local_28;
      in_stack_fffffffffffff938._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                     ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37ddc0);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pbVar7);
      ((pointer)in_stack_fffffffffffff938._M_current)->lrindices[*pcVar11] = true;
      in_stack_fffffffffffff940._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::unique_ptr<LRQstate,_void_(*)(void_*)>::operator->
                     ((unique_ptr<LRQstate,_void_(*)(void_*)> *)0x37ddf1);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pbVar7);
      ((pointer)in_stack_fffffffffffff940._M_current)->lrindices[*pcVar11] = true;
      puVar12 = std::max<unsigned_int>(local_3fc,&local_608);
      local_3fc[0] = *puVar12;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff910);
    }
    if ((local_18->quiet & 1U) == 0) {
      std::ostream::operator<<(&local_18->trace_message,std::endl<char,std::char_traits<char>>);
    }
    local_18->wpp = local_18->wpp * (local_3fc[0] + 1);
    base = setup_base((options_i *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    in_stack_fffffffffffff920 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffad0);
    base_00 = LEARNER::init_learner<LRQstate,example,LEARNER::learner<char,example>>
                        ((free_ptr<LRQstate> *)in_stack_fffffffffffff930,
                         (learner<char,_example> *)base,
                         (_func_void_LRQstate_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff920,
                         (_func_void_LRQstate_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff918,(size_t)in_stack_fffffffffffff910);
    LEARNER::learner<LRQstate,_example>::set_end_pass
              (in_stack_fffffffffffff930,(_func_void_LRQstate_ptr *)base);
    LEARNER::learner<LRQstate,_example>::set_finish
              (in_stack_fffffffffffff930,(_func_void_LRQstate_ptr *)base);
    in_stack_fffffffffffff910 = (vw *)LEARNER::make_base<LRQstate,example>(base_00);
    local_8 = in_stack_fffffffffffff910;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_3fc[1] = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff910);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff920);
  std::unique_ptr<LRQstate,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<LRQstate,_void_(*)(void_*)> *)in_stack_fffffffffffff920);
  return (base_learner *)local_8;
}

Assistant:

base_learner* lrq_setup(options_i& options, vw& all)
{
  auto lrq = scoped_calloc_or_throw<LRQstate>();
  vector<string> lrq_names;
  option_group_definition new_options("Low Rank Quadratics");
  new_options.add(make_option("lrq", lrq_names).keep().help("use low rank quadratic features"))
      .add(make_option("lrqdropout", lrq->dropout).keep().help("use dropout training for low rank quadratic features"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrq"))
    return nullptr;

  uint32_t maxk = 0;
  lrq->all = &all;

  for (size_t i = 0; i < lrq_names.size(); i++) lrq_names[i] = spoof_hex_encoded_namespaces(lrq_names[i]);

  new (&lrq->lrpairs) std::set<std::string>(lrq_names.begin(), lrq_names.end());

  lrq->initial_seed = lrq->seed = all.random_seed | 8675309;

  if (!all.quiet)
  {
    all.trace_message << "creating low rank quadratic features for pairs: ";
    if (lrq->dropout)
      all.trace_message << "(using dropout) ";
  }

  for (string const& i : lrq->lrpairs)
  {
    if (!all.quiet)
    {
      if ((i.length() < 3) || !valid_int(i.c_str() + 2))
        THROW("error, low-rank quadratic features must involve two sets and a rank.");

      all.trace_message << i << " ";
    }
    // TODO: colon-syntax

    unsigned int k = atoi(i.c_str() + 2);

    lrq->lrindices[(int)i[0]] = 1;
    lrq->lrindices[(int)i[1]] = 1;

    maxk = max(maxk, k);
  }

  if (!all.quiet)
    all.trace_message << endl;

  all.wpp = all.wpp * (uint64_t)(1 + maxk);
  learner<LRQstate, example>& l = init_learner(
      lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, 1 + maxk);
  l.set_end_pass(reset_seed);
  l.set_finish(finish);

  // TODO: leaks memory ?
  return make_base(l);
}